

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::GenerateBlockVisitor,_true,_false,_false,_false>::
visit<slang::ast::VariableDeclStatement>
          (ASTVisitor<netlist::GenerateBlockVisitor,_true,_false,_false,_false> *this,
          VariableDeclStatement *t)

{
  bool bVar1;
  VariableDeclStatement *in_RSI;
  ASTVisitor<netlist::GenerateBlockVisitor,_true,_false,_false,_false> *in_RDI;
  
  bVar1 = Statement::bad(&in_RSI->super_Statement);
  if (!bVar1) {
    visitDefault<slang::ast::VariableDeclStatement>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }